

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32(Preprocessor *this,PragmaExpressionSyntax *expr)

{
  SourceRange range;
  SimplePragmaExpressionSyntax *pSVar1;
  SyntaxNode *in_RSI;
  Token token;
  anon_class_16_2_3fdfa3b0 checkResult;
  undefined8 in_stack_ffffffffffffff38;
  undefined2 uVar2;
  Token *in_stack_ffffffffffffff40;
  Preprocessor *in_stack_ffffffffffffff48;
  SourceLocation in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  DiagCode code;
  undefined1 in_stack_ffffffffffffff70 [16];
  SyntaxNode *in_stack_ffffffffffffff90;
  undefined1 local_68 [48];
  undefined8 local_38;
  Info *local_30;
  _Optional_payload_base<unsigned_int> local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0);
  uVar2 = (undefined2)((ulong)in_stack_ffffffffffffff38 >> 0x30);
  if (in_RSI->kind == SimplePragmaExpression) {
    pSVar1 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>(in_RSI);
    local_38._0_2_ = (pSVar1->value).kind;
    local_38._2_1_ = (pSVar1->value).field_0x2;
    local_38._3_1_ = (pSVar1->value).numFlags;
    local_38._4_4_ = (pSVar1->value).rawLen;
    local_30 = (pSVar1->value).info;
    if ((undefined2)local_38 == 5) {
      Token::intValue((Token *)in_stack_ffffffffffffff48);
      local_8 = (_Optional_payload_base<unsigned_int>)
                requireUInt32::anon_class_16_2_3fdfa3b0::operator()
                          (in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_);
      SVInt::~SVInt((SVInt *)in_stack_ffffffffffffff50);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)local_8;
    }
    if ((undefined2)local_38 == 8) {
      Token::realValue(in_stack_ffffffffffffff40);
      SVInt::fromDouble((bitwidth_t)((ulong)local_68 >> 0x20),(double)in_stack_ffffffffffffff40,
                        SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0));
      local_8 = (_Optional_payload_base<unsigned_int>)
                requireUInt32::anon_class_16_2_3fdfa3b0::operator()
                          (in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_);
      SVInt::~SVInt((SVInt *)local_8);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)local_8;
    }
  }
  else if (in_RSI->kind == NumberPragmaExpression) {
    slang::syntax::SyntaxNode::as<slang::syntax::NumberPragmaExpressionSyntax>(in_RSI);
    Token::intValue((Token *)in_stack_ffffffffffffff48);
    local_8 = (_Optional_payload_base<unsigned_int>)
              requireUInt32::anon_class_16_2_3fdfa3b0::operator()
                        (in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_);
    SVInt::~SVInt((SVInt *)in_stack_ffffffffffffff50);
    return (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)local_8;
  }
  slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
  range.endLoc = in_stack_ffffffffffffff58;
  range.startLoc = in_stack_ffffffffffffff50;
  addDiag(in_stack_ffffffffffffff48,code,range);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x37fe20);
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}